

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::relocate
          (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *this,qsizetype offset,
          AnchorVertex ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *in_RDI;
  AnchorVertex ***unaff_retaddr;
  AnchorVertex **res;
  AnchorVertex **first;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QtGraphicsAnchorLayout::AnchorVertex*,long_long>
            (first,(longlong)in_RDI,(AnchorVertex **)0x95c817);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex*>,QtGraphicsAnchorLayout::AnchorVertex*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }